

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void boxcoxtest(void)

{
  double *y_00;
  double *bxcx;
  double lambda_00;
  double lambda;
  double *z;
  double *y;
  int N;
  double x [144];
  
  memcpy(&stack0xfffffffffffffb78,&DAT_0017ef80,0x480);
  y_00 = (double *)malloc(0x480);
  bxcx = (double *)malloc(0x480);
  lambda_00 = boxcox((double *)&stack0xfffffffffffffb78,0x90,(double *)0x0,y_00);
  mdisplay(y_00,1,0x90);
  inv_boxcox_eval(y_00,0x90,lambda_00,bxcx);
  mdisplay(bxcx,1,0x90);
  free(y_00);
  free(bxcx);
  return;
}

Assistant:

void boxcoxtest() {
	double x[144] = {112, 118, 132, 129, 121, 135, 148, 148, 136, 119, 104, 118,
        115, 126, 141, 135, 125, 149, 170, 170, 158, 133, 114, 140,
        145, 150, 178, 163, 172, 178, 199, 199, 184, 162, 146, 166,
        171, 180, 193, 181, 183, 218, 230, 242, 209, 191, 172, 194,
        196, 196, 236, 235, 229, 243, 264, 272, 237, 211, 180, 201,
        204, 188, 235, 227, 234, 264, 302, 293, 259, 229, 203, 229,
        242, 233, 267, 269, 270, 315, 364, 347, 312, 274, 237, 278,
        284, 277, 317, 313, 318, 374, 413, 405, 355, 306, 271, 306,
        315, 301, 356, 348, 355, 422, 465, 467, 404, 347, 305, 336,
        340, 318, 362, 348, 363, 435, 491, 505, 404, 359, 310, 337,
        360, 342, 406, 396, 420, 472, 548, 559, 463, 407, 362, 405,
        417, 391, 419, 461, 472, 535, 622, 606, 508, 461, 390, 432
	};

	int N = 144;
	double *y,*z;
	double lambda;

	y = (double*) malloc(sizeof(double)*N);
	z = (double*) malloc(sizeof(double)*N);

	lambda = boxcox(x,N,NULL,y);
	
	mdisplay(y,1,N);

	inv_boxcox_eval(y,N,lambda,z);

	mdisplay(z,1,N);

	free(y);
	free(z);
}